

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O2

value YAML::Utils::ComputeStringFormat
                (string *str,EMITTER_MANIP strFormat,value flowType,bool escapeNonAscii)

{
  char *pcVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  RegEx *pRVar5;
  RegEx *pRVar6;
  char *pcVar7;
  undefined8 *puVar8;
  char *pcVar9;
  char *pcVar10;
  size_type sVar11;
  long lVar12;
  RegEx local_f8;
  undefined1 *local_d8;
  RegEx local_d0;
  RegEx local_b0;
  RegEx local_90;
  RegEx local_70;
  RegEx local_50;
  
  if (strFormat != Literal) {
    if (strFormat != SingleQuoted) {
      if (strFormat != Auto) {
        return DoubleQuoted;
      }
      bVar3 = IsNullString(str);
      if (!bVar3) {
        if (flowType == Flow) {
          pRVar5 = Exp::PlainScalarInFlow();
        }
        else {
          pRVar5 = Exp::PlainScalar();
        }
        bVar3 = RegEx::Matches(pRVar5,str);
        if (bVar3) {
          if ((str->_M_string_length != 0) &&
             ((str->_M_dataplus)._M_p[str->_M_string_length - 1] == ' ')) {
            return DoubleQuoted;
          }
          if ((anonymous_namespace)::
              IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
              disallowed_flow == '\0') {
            local_d8 = &(anonymous_namespace)::
                        IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
                        disallowed_flow;
            iVar4 = __cxa_guard_acquire();
            if (iVar4 != 0) {
              pRVar5 = Exp::EndScalarInFlow();
              pRVar6 = Exp::BlankOrBreak();
              Exp::Comment();
              operator+(&local_b0,pRVar6,&local_d0);
              operator|(&local_90,pRVar5,&local_b0);
              pRVar5 = Exp::NotPrintable();
              operator|(&local_70,&local_90,pRVar5);
              pRVar5 = Exp::Utf8_ByteOrderMark();
              operator|(&local_50,&local_70,pRVar5);
              pRVar5 = Exp::Break();
              operator|(&local_f8,&local_50,pRVar5);
              pRVar5 = Exp::Tab();
              operator|((RegEx *)(anonymous_namespace)::
                                 IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)
                                 ::disallowed_flow,&local_f8,pRVar5);
              __cxa_atexit(RegEx::~RegEx,
                           (anonymous_namespace)::
                           IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)
                           ::disallowed_flow,&__dso_handle);
              std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_f8.m_params);
              std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_50.m_params);
              std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_70.m_params);
              std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_90.m_params);
              std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_b0.m_params);
              std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_d0.m_params);
              (anonymous_namespace)::
              IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
              disallowed_flow =
                   (anonymous_namespace)::
                   IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
                   disallowed_flow;
              __cxa_guard_release(&(anonymous_namespace)::
                                   IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)
                                   ::disallowed_flow);
            }
          }
          if ((anonymous_namespace)::
              IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
              disallowed_block == '\0') {
            local_d8 = &(anonymous_namespace)::
                        IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
                        disallowed_block;
            iVar4 = __cxa_guard_acquire();
            if (iVar4 != 0) {
              pRVar5 = Exp::EndScalar();
              pRVar6 = Exp::BlankOrBreak();
              Exp::Comment();
              operator+(&local_b0,pRVar6,&local_d0);
              operator|(&local_90,pRVar5,&local_b0);
              pRVar5 = Exp::NotPrintable();
              operator|(&local_70,&local_90,pRVar5);
              pRVar5 = Exp::Utf8_ByteOrderMark();
              operator|(&local_50,&local_70,pRVar5);
              pRVar5 = Exp::Break();
              operator|(&local_f8,&local_50,pRVar5);
              pRVar5 = Exp::Tab();
              operator|((RegEx *)(anonymous_namespace)::
                                 IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)
                                 ::disallowed_block,&local_f8,pRVar5);
              __cxa_atexit(RegEx::~RegEx,
                           (anonymous_namespace)::
                           IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)
                           ::disallowed_block,&__dso_handle);
              std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_f8.m_params);
              std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_50.m_params);
              std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_70.m_params);
              std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_90.m_params);
              std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_b0.m_params);
              std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_d0.m_params);
              (anonymous_namespace)::
              IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
              disallowed_block =
                   (anonymous_namespace)::
                   IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
                   disallowed_block;
              __cxa_guard_release(&(anonymous_namespace)::
                                   IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)
                                   ::disallowed_block);
            }
          }
          puVar8 = &(anonymous_namespace)::
                    IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
                    disallowed_block;
          if (flowType == Flow) {
            puVar8 = &(anonymous_namespace)::
                      IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
                      disallowed_flow;
          }
          pRVar5 = (RegEx *)*puVar8;
          local_f8._0_8_ = (str->_M_dataplus)._M_p;
          local_f8.m_params.super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)str->_M_string_length;
          local_f8.m_params.super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          while( true ) {
            if (local_f8.m_params.super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                _M_impl.super__Vector_impl_data._M_start <=
                local_f8.m_params.super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              return Plain;
            }
            bVar3 = RegEx::Matches<YAML::StringCharSource>(pRVar5,(StringCharSource *)&local_f8);
            if (bVar3) break;
            if ((escapeNonAscii) &&
               (*(char *)(local_f8._0_8_ +
                         (long)local_f8.m_params.
                               super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl
                               .super__Vector_impl_data._M_finish) < '\0')) {
              return DoubleQuoted;
            }
            local_f8.m_params.super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)((long)&(local_f8.m_params.
                                   super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                                   _M_impl.super__Vector_impl_data._M_finish)->m_op + 1);
          }
          return DoubleQuoted;
        }
        return DoubleQuoted;
      }
      return DoubleQuoted;
    }
    pcVar2 = (str->_M_dataplus)._M_p;
    sVar11 = str->_M_string_length;
    pcVar1 = pcVar2 + sVar11;
    pcVar7 = pcVar2 + 1;
    for (lVar12 = (long)sVar11 >> 2; 0 < lVar12; lVar12 = lVar12 + -1) {
      if ((pcVar7[-1] == '\n') || (pcVar7[-1] < '\0' && escapeNonAscii)) {
        pcVar7 = pcVar7 + -1;
        goto LAB_0069dc5a;
      }
      if ((*pcVar7 == '\n') || (*pcVar7 < '\0' && escapeNonAscii)) goto LAB_0069dc5a;
      if ((pcVar7[1] == '\n') || (pcVar7[1] < '\0' && escapeNonAscii)) {
        pcVar7 = pcVar7 + 1;
        goto LAB_0069dc5a;
      }
      if ((pcVar7[2] == '\n') || (pcVar7[2] < '\0' && escapeNonAscii)) {
        pcVar7 = pcVar7 + 2;
        goto LAB_0069dc5a;
      }
      pcVar7 = pcVar7 + 4;
      sVar11 = sVar11 - 4;
    }
    pcVar9 = pcVar7 + -1;
    if (sVar11 != 1) {
      if (sVar11 == 3) {
        pcVar10 = pcVar7;
        pcVar7 = pcVar9;
        if (*pcVar9 == '\n' || *pcVar9 < '\0' && escapeNonAscii) goto LAB_0069dc5a;
      }
      else {
        pcVar10 = pcVar9;
        pcVar7 = pcVar1;
        if (sVar11 != 2) goto LAB_0069dc5a;
      }
      pcVar7 = pcVar10;
      if (*pcVar10 == '\n' || *pcVar10 < '\0' && escapeNonAscii) goto LAB_0069dc5a;
      pcVar9 = pcVar10 + 1;
    }
    pcVar10 = pcVar1;
    if (escapeNonAscii) {
      pcVar10 = pcVar9;
    }
    if (-1 < *pcVar9) {
      pcVar10 = pcVar1;
    }
    pcVar7 = pcVar9;
    if (*pcVar9 != '\n') {
      pcVar7 = pcVar10;
    }
LAB_0069dc5a:
    return (pcVar7 != pcVar1) + SingleQuoted;
  }
  if (flowType == Flow) {
    return DoubleQuoted;
  }
  pcVar2 = (str->_M_dataplus)._M_p;
  sVar11 = str->_M_string_length;
  pcVar1 = pcVar2 + sVar11;
  pcVar7 = pcVar2 + 1;
  for (lVar12 = (long)sVar11 >> 2; 0 < lVar12; lVar12 = lVar12 + -1) {
    if (pcVar7[-1] < '\0' && escapeNonAscii) {
      pcVar9 = pcVar7 + -1;
      goto LAB_0069dd34;
    }
    pcVar9 = pcVar7;
    if (*pcVar7 < '\0' && escapeNonAscii) goto LAB_0069dd34;
    if (pcVar7[1] < '\0' && escapeNonAscii) {
      pcVar9 = pcVar7 + 1;
      goto LAB_0069dd34;
    }
    if (pcVar7[2] < '\0' && escapeNonAscii) {
      pcVar9 = pcVar7 + 2;
      goto LAB_0069dd34;
    }
    pcVar7 = pcVar7 + 4;
    sVar11 = sVar11 - 4;
  }
  pcVar10 = pcVar7 + -1;
  if (sVar11 != 1) {
    if (sVar11 == 3) {
      pcVar9 = pcVar10;
      if (*pcVar10 < '\0' && escapeNonAscii) goto LAB_0069dd34;
    }
    else {
      pcVar7 = pcVar10;
      if (sVar11 != 2) {
        return Literal;
      }
    }
    pcVar9 = pcVar7;
    if (*pcVar7 < '\0' && escapeNonAscii) goto LAB_0069dd34;
    pcVar10 = pcVar7 + 1;
  }
  pcVar9 = pcVar1;
  if (escapeNonAscii) {
    pcVar9 = pcVar10;
  }
  if (-1 < *pcVar10) {
    pcVar9 = pcVar1;
  }
LAB_0069dd34:
  if (pcVar9 == pcVar1) {
    return Literal;
  }
  return DoubleQuoted;
}

Assistant:

StringFormat::value ComputeStringFormat(const std::string& str,
                                        EMITTER_MANIP strFormat,
                                        FlowType::value flowType,
                                        bool escapeNonAscii) {
  switch (strFormat) {
    case Auto:
      if (IsValidPlainScalar(str, flowType, escapeNonAscii)) {
        return StringFormat::Plain;
      }
      return StringFormat::DoubleQuoted;
    case SingleQuoted:
      if (IsValidSingleQuotedScalar(str, escapeNonAscii)) {
        return StringFormat::SingleQuoted;
      }
      return StringFormat::DoubleQuoted;
    case DoubleQuoted:
      return StringFormat::DoubleQuoted;
    case Literal:
      if (IsValidLiteralScalar(str, flowType, escapeNonAscii)) {
        return StringFormat::Literal;
      }
      return StringFormat::DoubleQuoted;
    default:
      break;
  }

  return StringFormat::DoubleQuoted;
}